

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O1

void __thiscall
crnlib::
hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
::rehash(hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
         *this,uint new_hash_size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  ulong uVar5;
  raw_node *prVar6;
  raw_node *prVar7;
  long lVar8;
  ulong uVar9;
  raw_node *prVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
  new_map;
  elemental_vector local_38;
  uint local_28;
  undefined8 local_20;
  
  if ((this->m_num_valid <= new_hash_size) &&
     (uVar9 = (ulong)new_hash_size, (this->m_values).m_size != new_hash_size)) {
    local_38.m_p = (raw_node *)0x0;
    local_38.m_size = 0;
    local_38.m_capacity = 0;
    local_28 = 0x20;
    local_20 = 0;
    if (new_hash_size != 0) {
      if (new_hash_size != 0) {
        elemental_vector::increase_capacity
                  (&local_38,new_hash_size,new_hash_size == 1,0x10,
                   vector<crnlib::hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>::raw_node>
                   ::object_mover,false);
      }
      if (new_hash_size - local_38.m_size != 0) {
        lVar8 = 0;
        do {
          ((raw_node *)((long)local_38.m_p + (local_38._8_8_ & 0xffffffff) * 0x10))->m_bits
          [lVar8 + 9] = '\0';
          lVar8 = lVar8 + 0x10;
        } while ((ulong)(new_hash_size - local_38.m_size) << 4 != lVar8);
      }
      local_38.m_size = new_hash_size;
    }
    uVar5 = local_20;
    local_28 = 0x20;
    if (1 < new_hash_size) {
      do {
        local_28 = local_28 - 1;
        uVar11 = (uint)uVar9;
        uVar9 = uVar9 >> 1;
      } while (3 < uVar11);
    }
    local_20 = local_20 & 0xffffffff;
    uVar9 = local_20;
    local_20._0_4_ = (uint)uVar5;
    uVar5 = (ulong)(this->m_values).m_size;
    if (uVar5 != 0) {
      prVar10 = (this->m_values).m_p;
      prVar6 = prVar10 + uVar5;
      local_20 = uVar9;
      do {
        if (prVar10->m_bits[9] != '\0') {
          uVar11 = (uint)(*(int *)prVar10->m_bits * -0x61c88647) >> ((byte)local_28 & 0x1f);
          prVar7 = (raw_node *)((long)local_38.m_p + (ulong)uVar11 * 0x10);
          if (((raw_node *)((long)local_38.m_p + (ulong)uVar11 * 0x10))->m_bits[9] != '\0') {
            uVar13 = uVar11;
            do {
              uVar12 = uVar13 - 1;
              if (uVar13 == 0) {
                uVar12 = local_38.m_size - 1;
              }
              if (uVar12 == uVar11) goto LAB_00143e42;
              prVar7 = prVar7 + -1;
              if (uVar13 == 0) {
                prVar7 = (raw_node *)((long)local_38.m_p + (ulong)(local_38.m_size - 1) * 0x10);
              }
              uVar13 = uVar12;
            } while (prVar7->m_bits[9] != '\0');
          }
          uVar4 = *(undefined8 *)(prVar10->m_bits + 8);
          *(undefined8 *)prVar7->m_bits = *(undefined8 *)prVar10->m_bits;
          *(undefined8 *)(prVar7->m_bits + 8) = uVar4;
          prVar10->m_bits[9] = '\0';
          local_20 = (ulong)((uint)local_20 + 1);
LAB_00143e42:
          if ((uint)local_20 == this->m_num_valid) break;
        }
        prVar10 = prVar10 + 1;
      } while (prVar10 != prVar6);
    }
    local_20._4_4_ = new_hash_size + 1 >> 1;
    prVar10 = (this->m_values).m_p;
    if (prVar10 != (raw_node *)0x0) {
      crnlib_free(prVar10);
      (this->m_values).m_p = (raw_node *)0x0;
      (this->m_values).m_size = 0;
      (this->m_values).m_capacity = 0;
    }
    this->m_hash_shift = 0x20;
    prVar10 = (this->m_values).m_p;
    (this->m_values).m_p = (raw_node *)local_38.m_p;
    uVar1 = (this->m_values).m_size;
    (this->m_values).m_size = local_38.m_size;
    uVar2 = (this->m_values).m_capacity;
    (this->m_values).m_capacity = local_38.m_capacity;
    local_38.m_capacity = uVar2;
    local_38.m_size = uVar1;
    this->m_hash_shift = local_28;
    local_28 = 0x20;
    uVar2 = this->m_num_valid;
    this->m_num_valid = (uint)local_20;
    uVar3 = this->m_grow_threshold;
    this->m_grow_threshold = local_20._4_4_;
    local_20 = CONCAT44(uVar3,uVar2);
    local_38.m_p = prVar10;
    if (uVar1 != 0) {
      if (prVar10 != (raw_node *)0x0) {
        crnlib_free(prVar10);
        local_38.m_p = (raw_node *)0x0;
        local_38.m_size = 0;
        local_38.m_capacity = 0;
      }
      local_20 = 0;
    }
    local_28 = 0x20;
    if ((raw_node *)local_38.m_p != (raw_node *)0x0) {
      crnlib_free(local_38.m_p);
    }
  }
  return;
}

Assistant:

inline void rehash(uint new_hash_size)
        {
            CRNLIB_ASSERT(new_hash_size >= m_num_valid);
            CRNLIB_ASSERT(math::is_power_of_2(new_hash_size));

            if ((new_hash_size < m_num_valid) || (new_hash_size == m_values.size()))
            {
                return;
            }

            hash_map new_map;
            new_map.m_values.resize(new_hash_size);
            new_map.m_hash_shift = 32U - math::floor_log2i(new_hash_size);
            CRNLIB_ASSERT(new_hash_size == (1U << (32U - new_map.m_hash_shift)));
            new_map.m_grow_threshold = UINT_MAX;

            node* pNode = reinterpret_cast<node*>(m_values.begin());
            node* pNode_end = pNode + m_values.size();

            while (pNode != pNode_end)
            {
                if (pNode->state)
                {
                    new_map.move_into(pNode);

                    if (new_map.m_num_valid == m_num_valid)
                    {
                        break;
                    }
                }

                pNode++;
            }

            new_map.m_grow_threshold = (new_hash_size + 1U) >> 1U;

            m_values.clear_no_destruction();
            m_hash_shift = 32;

            swap(new_map);
        }